

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_68(fglrx_ioctl_68 *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  mmt_buf *buf_00;
  
  if (d->ptr1 == 0) {
    iVar2 = _fglrx_field_enabled("ptr1");
    if (iVar2 == 0) goto LAB_0024b13e;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx);
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024b141;
    }
    fputs(" [no data]",_stdout);
LAB_0024b13e:
    buf = (mmt_buf *)0x0;
  }
LAB_0024b141:
  fglrx_pfx = ", ";
  if (d->ptr2 == 0) {
    iVar2 = _fglrx_field_enabled("ptr2");
    if (iVar2 == 0) goto LAB_0024b1df;
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr2: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr2: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->ptr2,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024b1e2;
    }
    fputs(" [no data]",_stdout);
LAB_0024b1df:
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024b1e2:
  fglrx_pfx = ", ";
  uVar1 = d->unk10;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk10");
    if (iVar2 != 0) goto LAB_0024b200;
  }
  else {
LAB_0024b200:
    fprintf(_stdout,"%sunk10: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk14;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk14");
    if (iVar2 != 0) goto LAB_0024b23f;
  }
  else {
LAB_0024b23f:
    fprintf(_stdout,"%sunk14: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk18;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk18");
    if (iVar2 != 0) goto LAB_0024b27e;
  }
  else {
LAB_0024b27e:
    fprintf(_stdout,"%sunk18: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk1c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk1c");
    if (iVar2 != 0) goto LAB_0024b2bd;
  }
  else {
LAB_0024b2bd:
    fprintf(_stdout,"%sunk1c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk20;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk20");
    if (iVar2 != 0) goto LAB_0024b2fc;
  }
  else {
LAB_0024b2fc:
    fprintf(_stdout,"%sunk20: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk24;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk24");
    if (iVar2 == 0) goto LAB_0024b35c;
  }
  fprintf(_stdout,"%sunk24: 0x%08x",", ",(ulong)uVar1);
LAB_0024b35c:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf_00,"ptr2[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_68(struct fglrx_ioctl_68 *d, struct mmt_memory_dump *args, int argc)
{
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	struct mmt_buf *data2 = fglrx_print_ptr(d, ptr2, args, argc);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	fglrx_print_x32(d, unk20);
	fglrx_print_x32(d, unk24);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
	if (data2)
		dump_mmt_buf_as_words_horiz(data2, "ptr2[]:");
}